

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype-exprs.h
# Opt level: O0

void __thiscall
wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>::visitTryTable
          (SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping> *this,TryTable *curr)

{
  Type sub;
  Unsubtyping *pUVar1;
  size_t sVar2;
  Type *pTVar3;
  Unsubtyping *pUVar4;
  Name *pNVar5;
  Expression *super;
  uint local_1c;
  Index i;
  TryTable *curr_local;
  SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping> *this_local;
  
  pUVar1 = self(this);
  anon_unknown_22::Unsubtyping::noteSubtype(pUVar1,curr->body,(Expression *)curr);
  local_1c = 0;
  while( true ) {
    sVar2 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                      (&(curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>
                      );
    if (sVar2 <= local_1c) break;
    pUVar1 = self(this);
    pTVar3 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                       (&(curr->sentTypes).
                         super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,(ulong)local_1c)
    ;
    sub.id = pTVar3->id;
    pUVar4 = self(this);
    pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->catchDests).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(ulong)local_1c)
    ;
    super = ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
            ::findBreakTarget(&(pUVar4->
                               super_WalkerPass<wasm::ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>_>
                               ).
                               super_ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
                              ,(Name)(pNVar5->super_IString).str);
    anon_unknown_22::Unsubtyping::noteSubtype(pUVar1,sub,super);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void visitTryTable(TryTable* curr) {
    self()->noteSubtype(curr->body, curr);
    for (Index i = 0; i < curr->catchTags.size(); i++) {
      self()->noteSubtype(curr->sentTypes[i],
                          self()->findBreakTarget(curr->catchDests[i]));
    }
  }